

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O1

BOOL HeapFree(HANDLE hHeap,DWORD dwFlags,LPVOID lpMem)

{
  BOOL BVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    if ((char *)hHeap == "econd() == true)") {
      if (dwFlags == 0) {
        BVar1 = 1;
        if (lpMem != (LPVOID)0x0) {
          PAL_free(lpMem);
        }
      }
      else {
        BVar1 = 0;
        fprintf(_stderr,"] %s %s:%d","HeapFree",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/memory/heap.cpp"
                ,0x138);
        fprintf(_stderr,"Invalid parameter dwFlags=%#x\n",(ulong)dwFlags);
        SetLastError(0x57);
      }
    }
    else {
      SetLastError(0x57);
      BVar1 = 0;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return BVar1;
    }
  }
  abort();
}

Assistant:

BOOL
PALAPI
HeapFree(
    IN HANDLE hHeap,
    IN DWORD dwFlags,
    IN LPVOID lpMem)
{
    BOOL bRetVal = FALSE;

    PERF_ENTRY(HeapFree);
    ENTRY("HeapFree (hHeap=%p, dwFlags = %#x, lpMem=%p)\n",
          hHeap, dwFlags, lpMem);

#ifdef __APPLE__
    if (hHeap == NULL)
#else // __APPLE__
    if (hHeap != (HANDLE) DUMMY_HEAP)
#endif // __APPLE__ else
    {
        ERROR("Invalid heap handle\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    if (dwFlags != 0)
    {
        ASSERT("Invalid parameter dwFlags=%#x\n", dwFlags);
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    if (!lpMem)
    {
        bRetVal = TRUE;
        goto done;
    }

    bRetVal = TRUE;
#ifdef __APPLE__
    // This is patterned off of InternalFree in malloc.cpp.
    {
        malloc_zone_free((malloc_zone_t *)hHeap, lpMem);
    }
#else // __APPLE__
    PAL_free (lpMem);
#endif // __APPLE__ else

done:
    LOGEXIT( "HeapFree returning BOOL %d\n", bRetVal );
    PERF_EXIT(HeapFree);
    return bRetVal;
}